

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O2

void StoreHuffmanCode(VP8LBitWriter *bw,HuffmanTree *huff_tree,HuffmanTreeToken *tokens,
                     HuffmanTreeCode *huffman_code)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  int bits;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  uint32_t bits_00;
  ulong uVar9;
  uint uVar10;
  ulong local_110;
  int symbols [2];
  HuffmanTreeCode huffman_code_1;
  uint8_t code_length_bitdepth [19];
  uint8_t local_c8 [32];
  uint32_t histogram [19];
  uint16_t code_length_bitdepth_symbols [19];
  
  symbols[0] = 0;
  symbols[1] = 0;
  iVar5 = huffman_code->num_symbols;
  lVar6 = 0;
  iVar8 = 0;
  while ((lVar6 < iVar5 && (iVar8 < 3))) {
    if (huffman_code->code_lengths[lVar6] != '\0') {
      if (iVar8 < 2) {
        symbols[iVar8] = (int)lVar6;
      }
      iVar8 = iVar8 + 1;
    }
    lVar6 = lVar6 + 1;
  }
  if (iVar8 == 0) {
    bits_00 = 1;
    iVar5 = 4;
LAB_00161f2d:
    VP8LPutBits(bw,bits_00,iVar5);
    return;
  }
  bits = symbols[0];
  bits_00 = symbols[1];
  if (symbols[1] < 0x100 && (symbols[0] < 0x100 && iVar8 < 3)) {
    VP8LPutBits(bw,1,1);
    VP8LPutBits(bw,iVar8 - 1,1);
    iVar5 = 8;
    if (bits < 2) {
      iVar5 = 1;
    }
    VP8LPutBits(bw,(uint)(1 < bits),1);
    VP8LPutBits(bw,bits,iVar5);
    if (iVar8 == 2) {
      iVar5 = 8;
      goto LAB_00161f2d;
    }
  }
  else {
    huffman_code_1.code_lengths = code_length_bitdepth;
    code_length_bitdepth[0] = '\0';
    code_length_bitdepth[1] = '\0';
    code_length_bitdepth[2] = '\0';
    code_length_bitdepth[3] = '\0';
    code_length_bitdepth[4] = '\0';
    code_length_bitdepth[5] = '\0';
    code_length_bitdepth[6] = '\0';
    code_length_bitdepth[7] = '\0';
    code_length_bitdepth[8] = '\0';
    code_length_bitdepth[9] = '\0';
    code_length_bitdepth[10] = '\0';
    code_length_bitdepth[0xb] = '\0';
    code_length_bitdepth[0xc] = '\0';
    code_length_bitdepth[0xd] = '\0';
    code_length_bitdepth[0xe] = '\0';
    code_length_bitdepth[0xf] = '\0';
    code_length_bitdepth[0x10] = '\0';
    code_length_bitdepth[0x11] = '\0';
    code_length_bitdepth[0x12] = '\0';
    huffman_code_1.codes = code_length_bitdepth_symbols;
    code_length_bitdepth_symbols[8] = 0;
    code_length_bitdepth_symbols[9] = 0;
    code_length_bitdepth_symbols[10] = 0;
    code_length_bitdepth_symbols[0xb] = 0;
    code_length_bitdepth_symbols[0xc] = 0;
    code_length_bitdepth_symbols[0xd] = 0;
    code_length_bitdepth_symbols[0xe] = 0;
    code_length_bitdepth_symbols[0xf] = 0;
    code_length_bitdepth_symbols[0x10] = 0;
    code_length_bitdepth_symbols[0x11] = 0;
    code_length_bitdepth_symbols[0x12] = 0;
    code_length_bitdepth_symbols[0] = 0;
    code_length_bitdepth_symbols[1] = 0;
    code_length_bitdepth_symbols[2] = 0;
    code_length_bitdepth_symbols[3] = 0;
    code_length_bitdepth_symbols[4] = 0;
    code_length_bitdepth_symbols[5] = 0;
    code_length_bitdepth_symbols[6] = 0;
    code_length_bitdepth_symbols[7] = 0;
    huffman_code_1.num_symbols = 0x13;
    uVar9 = 0;
    VP8LPutBits(bw,0,1);
    uVar4 = VP8LCreateCompressedHuffmanTree(huffman_code,tokens,iVar5);
    histogram[0x10] = 0;
    histogram[0x11] = 0;
    histogram[0x12] = 0;
    histogram[0xc] = 0;
    histogram[0xd] = 0;
    histogram[0xe] = 0;
    histogram[0xf] = 0;
    histogram[8] = 0;
    histogram[9] = 0;
    histogram[10] = 0;
    histogram[0xb] = 0;
    histogram[4] = 0;
    histogram[5] = 0;
    histogram[6] = 0;
    histogram[7] = 0;
    histogram[0] = 0;
    histogram[1] = 0;
    histogram[2] = 0;
    histogram[3] = 0;
    local_c8[0] = '\0';
    local_c8[1] = '\0';
    local_c8[2] = '\0';
    local_c8[3] = '\0';
    local_c8[4] = '\0';
    local_c8[5] = '\0';
    local_c8[6] = '\0';
    local_c8[7] = '\0';
    local_c8[8] = '\0';
    local_c8[9] = '\0';
    local_c8[10] = '\0';
    local_c8[0xb] = '\0';
    local_c8[0xc] = '\0';
    local_c8[0xd] = '\0';
    local_c8[0xe] = '\0';
    local_c8[0xf] = '\0';
    local_c8[0x10] = '\0';
    local_c8[0x11] = '\0';
    local_c8[0x12] = '\0';
    uVar7 = 0;
    if (0 < (int)uVar4) {
      uVar7 = (ulong)uVar4;
    }
    for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      histogram[tokens[uVar9].code] = histogram[tokens[uVar9].code] + 1;
    }
    VP8LCreateHuffmanTree(histogram,7,local_c8,huff_tree,&huffman_code_1);
    uVar7 = 0x13;
    uVar10 = 0x14;
    do {
      if (uVar7 < 5) {
        uVar10 = 4;
        break;
      }
      pbVar1 = &UNK_0018091f + uVar7;
      uVar7 = uVar7 - 1;
      uVar10 = uVar10 - 1;
    } while (code_length_bitdepth[*pbVar1] == '\0');
    VP8LPutBits(bw,uVar10 - 4,4);
    for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      VP8LPutBits(bw,(uint)code_length_bitdepth
                           [(byte)(&StoreHuffmanTreeOfHuffmanTreeToBitMask_kStorageOrder)[uVar7]],3)
      ;
    }
    ClearHuffmanTreeIfOnlyOneSymbol(&huffman_code_1);
    uVar9 = (ulong)((int)uVar4 >> 0x1f & uVar4);
    iVar5 = 0;
    for (uVar7 = (ulong)uVar4; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
      bVar2 = tokens[uVar7 - 1].code;
      if ((0x12 < bVar2) || ((0x60001U >> (bVar2 & 0x1f) & 1) == 0)) {
        uVar9 = uVar7 & 0xffffffff;
        break;
      }
      iVar5 = iVar5 + (uint)code_length_bitdepth[bVar2];
      if ((ulong)bVar2 == 0x12) {
        iVar5 = iVar5 + 7;
      }
      else if (bVar2 == 0x11) {
        iVar5 = iVar5 + 3;
      }
    }
    iVar8 = (int)uVar9;
    VP8LPutBits(bw,(uint)(0xc < iVar5 && 1 < iVar8),1);
    local_110 = (ulong)uVar4;
    if (0xc < iVar5 && 1 < iVar8) {
      if (iVar8 == 2) {
        VP8LPutBits(bw,0,5);
        local_110 = 2;
      }
      else {
        uVar10 = iVar8 - 2;
        uVar4 = 0x1f;
        if (uVar10 != 0) {
          for (; uVar10 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        VP8LPutBits(bw,uVar4 >> 1,3);
        VP8LPutBits(bw,uVar10,(uVar4 & 0x1e) + 2);
        local_110 = uVar9;
      }
    }
    uVar7 = 0;
    if ((int)local_110 < 1) {
      local_110 = uVar7;
    }
    for (; local_110 != uVar7; uVar7 = uVar7 + 1) {
      bVar2 = tokens[uVar7].code;
      bVar3 = tokens[uVar7].extra_bits;
      VP8LPutBits(bw,(uint)huffman_code_1.codes[bVar2],(uint)huffman_code_1.code_lengths[bVar2]);
      if ((byte)(bVar2 - 0x10) < 3) {
        VP8LPutBits(bw,(uint)bVar3,*(int *)(&DAT_00180958 + (ulong)(byte)(bVar2 - 0x10) * 4));
      }
    }
  }
  return;
}

Assistant:

static void StoreHuffmanCode(VP8LBitWriter* const bw,
                             HuffmanTree* const huff_tree,
                             HuffmanTreeToken* const tokens,
                             const HuffmanTreeCode* const huffman_code) {
  int i;
  int count = 0;
  int symbols[2] = { 0, 0 };
  const int kMaxBits = 8;
  const int kMaxSymbol = 1 << kMaxBits;

  // Check whether it's a small tree.
  for (i = 0; i < huffman_code->num_symbols && count < 3; ++i) {
    if (huffman_code->code_lengths[i] != 0) {
      if (count < 2) symbols[count] = i;
      ++count;
    }
  }

  if (count == 0) {   // emit minimal tree for empty cases
    // bits: small tree marker: 1, count-1: 0, large 8-bit code: 0, code: 0
    VP8LPutBits(bw, 0x01, 4);
  } else if (count <= 2 && symbols[0] < kMaxSymbol && symbols[1] < kMaxSymbol) {
    VP8LPutBits(bw, 1, 1);  // Small tree marker to encode 1 or 2 symbols.
    VP8LPutBits(bw, count - 1, 1);
    if (symbols[0] <= 1) {
      VP8LPutBits(bw, 0, 1);  // Code bit for small (1 bit) symbol value.
      VP8LPutBits(bw, symbols[0], 1);
    } else {
      VP8LPutBits(bw, 1, 1);
      VP8LPutBits(bw, symbols[0], 8);
    }
    if (count == 2) {
      VP8LPutBits(bw, symbols[1], 8);
    }
  } else {
    StoreFullHuffmanCode(bw, huff_tree, tokens, huffman_code);
  }
}